

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

size_t (anonymous_namespace)::miniz::mz_zip_file_read_func
                 (void *pOpaque,mz_uint64 file_ofs,void *pBuf,size_t n)

{
  int iVar1;
  __off64_t _Var2;
  size_t in_RCX;
  void *in_RDX;
  long in_RSI;
  long in_RDI;
  mz_int64 cur_ofs;
  mz_zip_archive *pZip;
  undefined8 local_8;
  
  _Var2 = ftello64(*(FILE **)(*(long *)(in_RDI + 0x58) + 0x60));
  if (in_RSI < 0) {
LAB_001da5f9:
    local_8 = 0;
  }
  else {
    if (_Var2 != in_RSI) {
      iVar1 = fseeko64(*(FILE **)(*(long *)(in_RDI + 0x58) + 0x60),in_RSI,0);
      if (iVar1 != 0) goto LAB_001da5f9;
    }
    local_8 = fread(in_RDX,1,in_RCX,*(FILE **)(*(long *)(in_RDI + 0x58) + 0x60));
  }
  return local_8;
}

Assistant:

static size_t mz_zip_file_read_func(void *pOpaque, mz_uint64 file_ofs,
                                    void *pBuf, size_t n) {
  mz_zip_archive *pZip = (mz_zip_archive *)pOpaque;
  mz_int64 cur_ofs = MZ_FTELL64(pZip->m_pState->m_pFile);
  if (((mz_int64)file_ofs < 0) ||
      (((cur_ofs != (mz_int64)file_ofs)) &&
       (MZ_FSEEK64(pZip->m_pState->m_pFile, (mz_int64)file_ofs, SEEK_SET))))
    return 0;
  return MZ_FREAD(pBuf, 1, n, pZip->m_pState->m_pFile);
}